

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O2

bool __thiscall
ConsistencyChecker::checkSectionTruncations
          (ConsistencyChecker *this,Constructor *ct,ConstructTpl *cttpl,bool isbigendian)

{
  OpTpl *op;
  pointer ppVVar1;
  bool bVar2;
  pointer ppOVar3;
  int4 i;
  long lVar4;
  bool bVar5;
  
  bVar5 = true;
  for (ppOVar3 = (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppOVar3 !=
      (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppOVar3 = ppOVar3 + 1) {
    op = *ppOVar3;
    if (op->output != (VarnodeTpl *)0x0) {
      bVar2 = checkVarnodeTruncation(this,ct,-1,op,op->output,isbigendian);
      bVar5 = (bool)(bVar5 & bVar2);
    }
    for (lVar4 = 0;
        ppVVar1 = (op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        lVar4 < (int)((ulong)((long)(op->input).
                                    super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3)
        ; lVar4 = lVar4 + 1) {
      bVar2 = checkVarnodeTruncation(this,ct,(int4)lVar4,op,ppVVar1[lVar4],isbigendian);
      bVar5 = (bool)(bVar5 & bVar2);
    }
  }
  return bVar5;
}

Assistant:

bool ConsistencyChecker::checkSectionTruncations(Constructor *ct,ConstructTpl *cttpl,bool isbigendian)

{ // Check all the varnodes that have an offset_plus template
  //     adjust the plus if we are bigendian
  //     make sure the truncation is valid
  vector<OpTpl *>::const_iterator iter;
  const vector<OpTpl *> &ops(cttpl->getOpvec());
  bool testresult = true;
  
  for(iter=ops.begin();iter!=ops.end();++iter) {
    OpTpl *op = *iter;
    VarnodeTpl *outvn = op->getOut();
    if (outvn != (VarnodeTpl *)0) {
      if (!checkVarnodeTruncation(ct,-1,op,outvn,isbigendian))
	testresult = false;
    }
    for(int4 i=0;i<op->numInput();++i) {
      if (!checkVarnodeTruncation(ct,i,op,op->getIn(i),isbigendian))
	testresult = false;
    }
  }
  return testresult;
}